

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O0

Slice __thiscall leveldb::CorruptionTest::Key(CorruptionTest *this,int i,string *storage)

{
  string *psVar1;
  char local_98 [8];
  char buf [100];
  string *storage_local;
  int i_local;
  CorruptionTest *this_local;
  
  unique0x10000084 = storage;
  snprintf(local_98,100,"%016d",(ulong)(uint)i);
  psVar1 = stack0xffffffffffffffd0;
  strlen(local_98);
  std::__cxx11::string::assign((char *)psVar1,(ulong)local_98);
  Slice::Slice((Slice *)&this_local,stack0xffffffffffffffd0);
  return _this_local;
}

Assistant:

Slice Key(int i, std::string* storage) {
    char buf[100];
    std::snprintf(buf, sizeof(buf), "%016d", i);
    storage->assign(buf, strlen(buf));
    return Slice(*storage);
  }